

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

bool ProcessCommand(char *buffer,Player *player,bool *client_connected)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *this;
  bool bVar4;
  string command;
  string arg;
  string local_488;
  string local_468;
  string local_448;
  char s_arg [512];
  char s_command [512];
  
  command._M_dataplus._M_p = (pointer)&command.field_2;
  command._M_string_length = 0;
  command.field_2._M_local_buf[0] = '\0';
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  arg.field_2._M_local_buf[0] = '\0';
  iVar2 = __isoc99_sscanf(buffer,"%s %s",s_command,s_arg);
  std::__cxx11::string::assign((char *)&command);
  std::__cxx11::string::assign((char *)&arg);
  bVar1 = std::operator==(&command,"join");
  if ((iVar2 == 2) && (bVar1)) {
    std::__cxx11::string::string((string *)&local_448,(string *)&arg);
    CreateJoinGame(player,&local_448);
    this = &local_448;
LAB_00103fee:
    std::__cxx11::string::~string((string *)this);
  }
  else {
    bVar1 = std::operator==(&command,"register");
    if ((iVar2 == 2) && (bVar1)) {
      std::__cxx11::string::string((string *)&local_468,(string *)&arg);
      Player::SetName(player,&local_468);
      std::__cxx11::string::~string((string *)&local_468);
      iVar2 = Player::GetSocket(player);
      SendStatus(iVar2,REGISTERED);
      poVar3 = std::operator<<((ostream *)&std::cout,"Registered player name \"");
      poVar3 = std::operator<<(poVar3,(string *)&arg);
      poVar3 = std::operator<<(poVar3,"\"");
      bVar4 = true;
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_0010408d;
    }
    bVar1 = std::operator==(&command,"list");
    if ((iVar2 == 1) && (bVar1)) {
      ListGames(player);
      Player::GetName_abi_cxx11_(&local_488,player);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_488);
      poVar3 = std::operator<<(poVar3," listed all open games");
      std::endl<char,std::char_traits<char>>(poVar3);
      this = &local_488;
      goto LAB_00103fee;
    }
    bVar1 = std::operator==(&command,"leave");
    bVar4 = false;
    if ((iVar2 != 1) || (!bVar1)) goto LAB_0010408d;
    iVar2 = Player::GetSocket(player);
    SendStatus(iVar2,PLAYER_DISCONNECT);
    *client_connected = false;
  }
  bVar4 = true;
LAB_0010408d:
  std::__cxx11::string::~string((string *)&arg);
  std::__cxx11::string::~string((string *)&command);
  return bVar4;
}

Assistant:

bool ProcessCommand(char buffer[], Player & player, bool & client_connected)
{
    char s_command[BUF_SIZE], s_arg[BUF_SIZE];
    string command, arg;
    bool valid_cmd = true;

    // Convert the input command into separate command and argument
    int num = sscanf(buffer, "%s %s", s_command, s_arg);
    command = s_command;
    arg = s_arg;

    // Scanf needs to have captured either one or two strings
    if(command == "join" && num == 2)
    {
        CreateJoinGame(player, arg);
    }
    else if (command == "register" && num == 2)
    {
        // Set the player's name
        player.SetName(arg);
        SendStatus(player.GetSocket(), REGISTERED);
        cout << "Registered player name \"" << arg << "\"" << endl;
    }
    else if (command == "list" && num == 1)
    {
        ListGames(player);
        cout << player.GetName() << " listed all open games" << endl;
    }
    else if (command == "leave" && num == 1)
    {
        SendStatus(player.GetSocket(), PLAYER_DISCONNECT);
        client_connected = false;
    }
    else
        valid_cmd = false;

    return valid_cmd;
}